

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall List<String>::merge(List<String> *this,List<String> *other)

{
  _Map_pointer ppSVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  _Deque_iterator<String,_String_&,_String_*> local_a8;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_88;
  _Deque_iterator<String,_const_String_&,_const_String_*> local_68;
  _Deque_iterator<String,_String_&,_String_*> local_48;
  
  ppSVar1 = (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
          (int)((ulong)((long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                             _M_impl.super__Deque_impl_data._M_finish._M_first) >> 5) +
          ((int)((ulong)((long)ppSVar1 -
                        (long)(this->_deque).super__Deque_base<String,_std::allocator<String>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
          (uint)(ppSVar1 == (_Map_pointer)0x0)) * 0x10;
  ppSVar1 = (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  std::deque<String,_std::allocator<String>_>::resize
            (&this->_deque,
             (long)(int)((int)((ulong)((long)(other->_deque).
                                             super__Deque_base<String,_std::allocator<String>_>.
                                             _M_impl.super__Deque_impl_data._M_start._M_last -
                                      (long)(other->_deque).
                                            super__Deque_base<String,_std::allocator<String>_>.
                                            _M_impl.super__Deque_impl_data._M_start._M_cur) >> 5) +
                         (int)((ulong)((long)(other->_deque).
                                             super__Deque_base<String,_std::allocator<String>_>.
                                             _M_impl.super__Deque_impl_data._M_finish._M_cur -
                                      (long)(other->_deque).
                                            super__Deque_base<String,_std::allocator<String>_>.
                                            _M_impl.super__Deque_impl_data._M_finish._M_first) >> 5)
                         + iVar3 +
                        ((((uint)((int)ppSVar1 -
                                 *(int *)&(other->_deque).
                                          super__Deque_base<String,_std::allocator<String>_>._M_impl
                                          .super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                        (uint)(ppSVar1 == (_Map_pointer)0x0)) * 0x10));
  local_68._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_cur =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_first =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_88._M_last =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_88._M_node =
       (other->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  local_a8._M_cur =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_a8._M_first =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_a8._M_node =
       (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  uVar2 = ((long)local_a8._M_cur - (long)local_a8._M_first >> 5) + (long)iVar3;
  if (uVar2 < 0x10) {
    local_a8._M_last =
         (this->_deque).super__Deque_base<String,_std::allocator<String>_>._M_impl.
         super__Deque_impl_data._M_start._M_last;
    local_a8._M_cur = local_a8._M_cur + iVar3;
  }
  else {
    uVar4 = uVar2 >> 4 | 0xf000000000000000;
    if (0 < (long)uVar2) {
      uVar4 = uVar2 >> 4;
    }
    local_a8._M_node = local_a8._M_node + uVar4;
    local_a8._M_first = *local_a8._M_node;
    local_a8._M_last = local_a8._M_first + 0x10;
    local_a8._M_cur = local_a8._M_first + uVar2 + uVar4 * -0x10;
  }
  std::__copy_move_a1<false,String,String_const&,String_const*,String>
            (&local_48,&local_68,&local_88,&local_a8);
  return;
}

Assistant:

void List<T>::merge (const List<T>& other)
{
	int oldsize = size();
	resize (size() + other.size());
	std::copy (other.begin(), other.end(), begin() + oldsize);
}